

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_details::save(xr_scene_details *this,xr_writer *w)

{
  undefined1 local_21;
  uint32_t local_20;
  undefined4 local_1c;
  
  xr_scene_revision::save(&(this->super_xr_scene_part).m_revision,w);
  xr_writer::w_chunk<unsigned_int>(w,0x1000,&DETMGR_VERSION);
  xr_writer::w_chunk<unsigned_int>(w,0x1006,&this->m_flags);
  xr_writer::open_chunk(w,0);
  details_header::save(&this->m_header,w);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  xr_writer::
  w_chunks<std::vector<xray_re::detail_object*,std::allocator<xray_re::detail_object*>>,write_detail>
            (w,&this->m_objects);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1003);
  local_21 = (undefined1)
             ((uint)(*(int *)&(this->m_indices).
                              super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->m_indices).
                             super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&local_21,1);
  xr_writer::
  w_seq<std::vector<xray_re::color_index*,std::allocator<xray_re::color_index*>>,write_color_index>
            (w,&this->m_indices);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,2);
  local_20 = this->m_num_slots;
  (*w->_vptr_xr_writer[2])(w,&local_20,4);
  if ((ulong)this->m_num_slots != 0) {
    (*w->_vptr_xr_writer[2])(w,this->m_slots,(ulong)this->m_num_slots << 4);
  }
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<xray_re::_aabb<float>>(w,0x1001,&this->m_bbox);
  if ((this->m_texture)._M_string_length != 0) {
    xr_writer::w_chunk(w,0x1002,&this->m_texture);
  }
  xr_writer::w_chunk<float>(w,0x1005,&this->m_density);
  xr_writer::open_chunk(w,0x1004);
  local_1c = (undefined4)
             ((ulong)((long)(this->m_snap_objects).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_snap_objects).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::
  w_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_writer::f_w_sz>
            (w,&this->m_snap_objects);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_details::save(xr_writer& w) const
{
	revision().save(w);
	w.w_chunk<uint32_t>(DETMGR_CHUNK_VERSION, DETMGR_VERSION);
	w.w_chunk<uint32_t>(DETMGR_CHUNK_FLAGS, m_flags);

// this is ignored in LE
//	m_header.object_count = uint32_t(m_objects.size() & UINT32_MAX);
	w.open_chunk(DETMGR_CHUNK_HEADER);
	m_header.save(w);
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_OBJECTS);
	w.w_chunks(m_objects, write_detail());
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_COLOR_INDEX);
	w.w_size_u8(m_indices.size());
	w.w_seq(m_indices, write_color_index());
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_SLOTS);
	w.w_u32(m_num_slots);
	w.w_cseq(m_num_slots, m_slots);
	w.close_chunk();

	w.w_chunk(DETMGR_CHUNK_BBOX, m_bbox);

	if (!m_texture.empty())
		w.w_chunk(DETMGR_CHUNK_TEXTURE, m_texture);

	w.w_chunk(DETMGR_CHUNK_DENSITY, m_density);

	w.open_chunk(DETMGR_CHUNK_SNAP_OBJECTS);
	w.w_size_u32(m_snap_objects.size());
	w.w_seq(m_snap_objects, xr_writer::f_w_sz());
	w.close_chunk();
}